

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear_glfw_gl3.h
# Opt level: O0

void nk_glfw3_clipboard_copy(nk_handle usr,char *text,int len)

{
  GLFWwindow *handle;
  int in_EDX;
  void *in_RSI;
  char *in_RDI;
  nk_glfw *glfw;
  char *str;
  
  if ((in_EDX != 0) &&
     (handle = (GLFWwindow *)malloc((long)in_EDX + 1), handle != (GLFWwindow *)0x0)) {
    memcpy(handle,in_RSI,(long)in_EDX);
    handle[in_EDX] = (GLFWwindow)0x0;
    glfwSetClipboardString(handle,in_RDI);
    free(handle);
  }
  return;
}

Assistant:

NK_INTERN void
nk_glfw3_clipboard_copy(nk_handle usr, const char *text, int len)
{
    char *str = 0;
    if (!len) return;
    str = (char*)malloc((size_t)len+1);
    if (!str) return;
    memcpy(str, text, (size_t)len);
    str[len] = '\0';
    struct nk_glfw* glfw = usr.ptr;
    glfwSetClipboardString(glfw->win, str);
    free(str);
}